

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

int hexval(int c)

{
  uint uVar1;
  
  uVar1 = c - 0x30U;
  if (9 < c - 0x30U) {
    if (c - 0x41U < 6) {
      return c + -0x37;
    }
    uVar1 = 0xffffffff;
    if (c - 0x61U < 6) {
      uVar1 = c - 0x57;
    }
  }
  return uVar1;
}

Assistant:

int hexval(int c)
{
    if (c >= '0' && c <= '9')
	return (c - '0');
    if (c >= 'A' && c <= 'F')
	return (c - 'A' + 10);
    if (c >= 'a' && c <= 'f')
	return (c - 'a' + 10);
    return (-1);
}